

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall CTcTokenizer::look_ahead(CTcTokenizer *this,char *s1,char *s2)

{
  CTcToken *tok;
  char *pcVar1;
  ulong uVar2;
  undefined4 uVar3;
  int iVar4;
  tc_toktyp_t tVar5;
  size_t sVar6;
  
  if ((((this->curtok_).typ_ == TOKT_SYM) &&
      (sVar6 = strlen(s1), (this->curtok_).text_len_ == sVar6)) &&
     (iVar4 = bcmp((this->curtok_).text_,s1,sVar6), iVar4 == 0)) {
    tVar5 = next(this);
    if (((tVar5 == TOKT_SYM) && (sVar6 = strlen(s2), (this->curtok_).text_len_ == sVar6)) &&
       (iVar4 = bcmp((this->curtok_).text_,s2,sVar6), iVar4 == 0)) {
      next(this);
      return 1;
    }
    tok = &this->curtok_;
    push(this,tok);
    (this->curtok_).field_0x20 = (this->prvtok_).field_0x20;
    tVar5 = (this->prvtok_).typ_;
    uVar3 = *(undefined4 *)&(this->prvtok_).field_0x4;
    pcVar1 = (this->prvtok_).text_;
    uVar2 = (this->prvtok_).int_val_;
    (this->curtok_).text_len_ = (this->prvtok_).text_len_;
    (this->curtok_).int_val_ = uVar2;
    tok->typ_ = tVar5;
    *(undefined4 *)&tok->field_0x4 = uVar3;
    (this->curtok_).text_ = pcVar1;
    (this->prvtok_).typ_ = TOKT_INVALID;
  }
  return 0;
}

Assistant:

int CTcTokenizer::look_ahead(const char *s1, const char *s2)
{
    /* if the first token doesn't match, the sequence doesn't match */
    if (cur() != TOKT_SYM || !cur_tok_matches(s1, strlen(s1)))
        return FALSE;

    /* check the next token - if it matches, we have a sequence match */
    if (next() == TOKT_SYM && cur_tok_matches(s2, strlen(s2)))
    {
        /* got it - skip the second token and return success */
        next();
        return TRUE;
    }

    /* 
     *   no match - but we've already read the next token, so put it back
     *   before we return failure 
     */
    unget();
    return FALSE;
}